

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O2

Real N_VMinQuotient_MultiFab(N_Vector num,N_Vector denom)

{
  uint uVar1;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar2;
  int j;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int k;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Box local_138;
  IntVect local_11c;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  this = *(FabArray<amrex::FArrayBox> **)((long)num->content + 8);
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)denom->content + 8);
  uVar1 = (this->super_FabArrayBase).n_comp;
  local_11c.vect[0] = 0;
  local_11c.vect[1] = 0;
  local_11c.vect[2] = 0;
  amrex::MFIter::MFIter(&mfi,&this->super_FabArrayBase,true);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  dVar15 = 1.79769313486232e+308;
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::growntilebox(&local_138,&mfi,&local_11c);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,this,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,this_00,&mfi);
    lVar2 = (long)local_138.smallend.vect[0];
    lVar9 = (long)local_138.smallend.vect[1];
    lVar8 = (long)local_138.smallend.vect[2];
    lVar12 = (lVar9 - local_d0.begin.y) * local_d0.jstride * 8 +
             (lVar8 - local_d0.begin.z) * local_d0.kstride * 8 + lVar2 * 8 +
             (long)local_d0.begin.x * -8 + (long)local_d0.p;
    lVar5 = (lVar9 - local_110.begin.y) * local_110.jstride * 8 +
            (lVar8 - local_110.begin.z) * local_110.kstride * 8 + lVar2 * 8 +
            (long)local_110.begin.x * -8 + (long)local_110.p;
    dVar17 = 1.79769313486232e+308;
    for (uVar4 = 0; lVar6 = lVar5, lVar7 = lVar8, lVar13 = lVar12, uVar4 != uVar1; uVar4 = uVar4 + 1
        ) {
      for (; lVar3 = lVar9, lVar10 = lVar6, lVar14 = lVar13, lVar7 <= local_138.bigend.vect[2];
          lVar7 = lVar7 + 1) {
        for (; lVar3 <= local_138.bigend.vect[1]; lVar3 = lVar3 + 1) {
          for (lVar11 = 0; lVar2 + lVar11 <= (long)local_138.bigend.vect[0]; lVar11 = lVar11 + 1) {
            dVar16 = *(double *)(lVar10 + lVar11 * 8);
            if (((dVar16 != 0.0) || (NAN(dVar16))) &&
               (dVar16 = *(double *)(lVar14 + lVar11 * 8) / dVar16, dVar16 <= dVar17)) {
              dVar17 = dVar16;
            }
          }
          lVar10 = lVar10 + local_110.jstride * 8;
          lVar14 = lVar14 + local_d0.jstride * 8;
        }
        lVar6 = lVar6 + local_110.kstride * 8;
        lVar13 = lVar13 + local_d0.kstride * 8;
      }
      lVar12 = lVar12 + local_d0.nstride * 8;
      lVar5 = lVar5 + local_110.nstride * 8;
    }
    if (dVar15 <= dVar17) {
      dVar17 = dVar15;
    }
    dVar15 = dVar17;
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  return dVar15;
}

Assistant:

amrex::Real N_VMinQuotient_MultiFab(N_Vector num, N_Vector denom)
{
    using namespace amrex;

    amrex::MultiFab *mf_num = amrex::sundials::getMFptr(num);
    amrex::MultiFab *mf_denom = amrex::sundials::getMFptr(denom);
    sunindextype ncomp = mf_num->nComp();

    // ghost cells not included
    int nghost = 0;
    Real min = amrex::ReduceMin(*mf_num, *mf_denom, nghost,
                 [=] AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& num_fab, Array4<Real const> const& denom_fab) -> Real
    {
         Real min_loc = std::numeric_limits<Real>::max();
         const auto lo = lbound(bx);
         const auto hi = ubound(bx);

         for (int c = 0; c < ncomp; ++c) {
            for (int k = lo.z; k <= hi.z; ++k) {
               for (int j = lo.y; j <= hi.y; ++j) {
                  for (int i = lo.x; i <= hi.x; ++i) {
                     if (denom_fab(i,j,k,c) != amrex::Real(0.0))
                     {
                        amrex::Real num = num_fab(i,j,k,c);
                        amrex::Real denom = denom_fab(i,j,k,c);
                        min_loc = SUNMIN(min_loc, num / denom);
                     }
                  }
               }
            }
         }
         return min_loc;
     });

    amrex::ParallelDescriptor::ReduceRealMin(min);

    return min;
}